

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O1

ExecutionResult * __thiscall
ASTNode::evaluate(ExecutionResult *__return_storage_ptr__,ASTNode *this,Context *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  pointer pcVar3;
  SchemeString *pSVar4;
  shared_ptr<SchemeObject> *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _List_node_base *p_Var8;
  bool bVar9;
  uchar uVar10;
  int iVar11;
  long lVar12;
  uint *puVar13;
  longlong lVar14;
  _List_node_base *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  SchemeSpecialForm *this_00;
  int *piVar17;
  longlong lVar18;
  _List_node_base *p_Var19;
  eval_error *this_01;
  ExecutionResult *this_02;
  runtime_error *this_03;
  shared_ptr<SchemeObject> *psVar20;
  TailContext *this_04;
  ASTNode *pAVar21;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *__x;
  double dVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> num;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> val_list;
  shared_ptr<SchemeObject> func;
  shared_ptr<SchemeProcedure> f;
  undefined1 local_e8 [24];
  default_delete<TailContext> local_d0 [16];
  double local_c0;
  undefined1 local_b8 [32];
  ExecutionResult local_98;
  _List_node_base *local_78;
  _List_node_base *local_70;
  string local_68;
  _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_48;
  
  pAVar21 = this;
  switch(this->type) {
  case NAME:
    local_b8._0_8_ = (SchemeString *)0x0;
    local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar9 = Context::get(context,&this->value,(shared_ptr<SchemeObject> *)local_b8);
    if ((SchemeString *)local_b8._0_8_ == (SchemeString *)0x0) {
      this_02 = (ExecutionResult *)__cxa_allocate_exception(0x10);
      if (bVar9) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,"Unassigned variable: ",&this->value);
        std::runtime_error::runtime_error((runtime_error *)this_02,(string *)local_e8);
        *(undefined ***)this_02 = &PTR__runtime_error_0017a350;
        __cxa_throw(this_02,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0012e4d6;
    }
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_b8._0_8_;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
      }
    }
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b8._8_8_;
    break;
  case INT:
    pSVar4 = (SchemeString *)(this->value)._M_dataplus._M_p;
    piVar17 = __errno_location();
    iVar11 = *piVar17;
    *piVar17 = 0;
    p_Var15 = (_List_node_base *)strtoll((char *)pSVar4,(char **)local_e8,10);
    if ((SchemeString *)local_e8._0_8_ == pSVar4) {
      std::__throw_invalid_argument("stoll");
LAB_0012e42f:
      this_01 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(this_01,"Trying to evaluate empty list");
LAB_0012e44b:
      __cxa_throw(this_01,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*piVar17 == 0) {
      *piVar17 = iVar11;
    }
    else if (*piVar17 == 0x22) {
      std::__throw_out_of_range("stoll");
      goto switchD_0012dc3f_caseD_6;
    }
    local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x20);
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->func).
    super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->func).
    super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&PTR___Sp_counted_ptr_inplace_0017a008;
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->args).
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__SchemeObject_0017a638;
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->args).
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = p_Var15;
    goto LAB_0012e1f5;
  case FLOAT:
    pAVar21 = (ASTNode *)&this->value;
    lVar12 = std::__cxx11::string::find((char)pAVar21,0x2f);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)local_e8,(ulong)pAVar21);
      std::__cxx11::string::substr((ulong)local_b8,(ulong)pAVar21);
      uVar6 = local_e8._0_8_;
      puVar13 = (uint *)__errno_location();
      uVar2 = *puVar13;
      this_02 = (ExecutionResult *)(ulong)uVar2;
      *puVar13 = 0;
      lVar14 = strtoll((char *)uVar6,(char **)&local_98,10);
      uVar7 = local_b8._0_8_;
      if (local_98._0_8_ == uVar6) {
        std::__throw_invalid_argument("stoll");
      }
      else {
        if (*puVar13 == 0) {
          *puVar13 = uVar2;
        }
        else if (*puVar13 == 0x22) {
          std::__throw_out_of_range("stoll");
          goto switchD_0012dc3f_caseD_4;
        }
        local_c0 = (double)CONCAT44(local_c0._4_4_,*puVar13);
        *puVar13 = 0;
        this_02 = &local_98;
        lVar18 = strtoll((char *)local_b8._0_8_,(char **)this_02,10);
        if (local_98._0_8_ != uVar7) {
          if (*puVar13 == 0) {
LAB_0012e0fc:
            *puVar13 = local_c0._0_4_;
          }
          else if (*puVar13 == 0x22) {
            std::__throw_out_of_range("stoll");
            goto LAB_0012e0fc;
          }
          if ((SchemeString *)local_b8._0_8_ != (SchemeString *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
          }
          dVar22 = (double)lVar18;
          if ((SchemeString *)local_e8._0_8_ != (SchemeString *)(local_e8 + 0x10)) {
            local_c0 = (double)lVar18;
            operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
            dVar22 = local_c0;
          }
          p_Var15 = (_List_node_base *)((double)lVar14 / dVar22);
          goto LAB_0012e1af;
        }
      }
      std::__throw_invalid_argument("stoll");
LAB_0012e4d6:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     "Undefined name: ",&this->value);
      std::runtime_error::runtime_error((runtime_error *)this_02,(string *)local_e8);
      *(undefined ***)this_02 = &PTR__runtime_error_0017a350;
      __cxa_throw(this_02,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pSVar4 = (SchemeString *)(((string *)pAVar21)->_M_dataplus)._M_p;
    piVar17 = __errno_location();
    iVar11 = *piVar17;
    *piVar17 = 0;
    p_Var15 = (_List_node_base *)strtod((char *)pSVar4,(char **)local_e8);
    if ((SchemeString *)local_e8._0_8_ == pSVar4) {
      std::__throw_invalid_argument("stod");
LAB_0012e52d:
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_03,"Trying to call not a function");
      *(undefined ***)this_03 = &PTR__runtime_error_0017a350;
      __cxa_throw(this_03,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*piVar17 == 0) {
      *piVar17 = iVar11;
    }
    else if (*piVar17 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012e028;
    }
LAB_0012e1af:
    local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x20);
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->func).
    super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->func).
    super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&PTR___Sp_counted_ptr_inplace_0017a468;
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->args).
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__SchemeObject_0017a698;
    (((TailContext *)
     local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->args).
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = p_Var15;
LAB_0012e1f5:
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             &((TailContext *)
              local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              args;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(((TailContext *)
                 local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->func).super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       &(((TailContext *)
         local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->func).
        super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 2;
    }
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    goto LAB_0012e3eb;
  case STRING:
switchD_0012dc3f_caseD_4:
    local_e8._0_8_ = (SchemeString *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SchemeString,std::allocator<SchemeString>,std::__cxx11::string_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
               (SchemeString **)local_e8,(allocator<SchemeString> *)local_b8,&pAVar21->value);
    uVar7 = local_e8._8_8_;
    uVar6 = local_e8._0_8_;
    local_e8._0_8_ = (SchemeString *)0x0;
    local_e8._8_8_ = (TailContext *)0x0;
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar6;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
    if ((TailContext *)uVar7 == (TailContext *)0x0) {
LAB_0012e028:
      (__return_storage_ptr__->tail_context)._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
      local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8._8_8_;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(((shared_ptr<SchemeProcedure> *)uVar7)->
                  super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(((shared_ptr<SchemeProcedure> *)uVar7)->
                  super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
      (__return_storage_ptr__->tail_context)._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
      local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8._8_8_;
      if ((TailContext *)uVar7 != (TailContext *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_e8._8_8_;
      }
    }
    break;
  case BOOL:
    iVar11 = std::__cxx11::string::compare((char *)&this->value);
    psVar20 = &scheme_false;
    if (iVar11 == 0) {
      psVar20 = &scheme_true;
    }
    psVar5 = &scheme_false;
    if (iVar11 == 0) {
      psVar5 = &scheme_true;
    }
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (psVar20->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var16 = (psVar5->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var16;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    return __return_storage_ptr__;
  case CHAR:
switchD_0012dc3f_caseD_6:
    pcVar3 = (this->value)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + (this->value)._M_string_length);
    uVar10 = char_name_to_char(&local_68);
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var16->_M_use_count = 1;
    p_Var16->_M_weak_count = 1;
    p_Var16->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017a508;
    p_Var16[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0017a8e8;
    *(uchar *)&p_Var16[1]._M_use_count = uVar10;
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var16 + 1);
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var16;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var16->_M_use_count = 2;
    }
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  case VECTOR:
    this_01 = (eval_error *)__cxa_allocate_exception(0x10);
    eval_error::runtime_error(this_01,"Trying to evaluate a vector");
    goto LAB_0012e44b;
  default:
    p_Var15 = (this->list).
              super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    __x = &this->list;
    if (p_Var15 == (_List_node_base *)__x) goto LAB_0012e42f;
    evaluate((ExecutionResult *)local_e8,(ASTNode *)p_Var15[1]._M_next,context);
    ExecutionResult::force_value(&local_98);
    if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)local_d0._0_8_ !=
        (TailContext *)0x0) {
      std::default_delete<TailContext>::operator()(local_d0,(TailContext *)local_d0._0_8_);
    }
    local_d0._0_8_ = (TailContext *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_);
    }
    if ((SchemeString *)local_98._0_8_ == (SchemeString *)0x0) {
      this_00 = (SchemeSpecialForm *)0x0;
    }
    else {
      this_00 = (SchemeSpecialForm *)
                __dynamic_cast(local_98._0_8_,&SchemeObject::typeinfo,&SchemeSpecialForm::typeinfo,0
                              );
    }
    if (this_00 == (SchemeSpecialForm *)0x0) {
      this_00 = (SchemeSpecialForm *)0x0;
      this_04 = (TailContext *)0x0;
    }
    else {
      this_04 = (TailContext *)
                local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((TailContext *)
          local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (TailContext *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(((shared_ptr<SchemeProcedure> *)
                     &(local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_vptr_SchemeObject)->
                    super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &(((shared_ptr<SchemeProcedure> *)
                     &(local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_vptr_SchemeObject)->
                    super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
    }
    if (this_00 == (SchemeSpecialForm *)0x0) {
      if ((SchemeString *)local_98._0_8_ == (SchemeString *)0x0) {
        local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                __dynamic_cast(local_98._0_8_,&SchemeObject::typeinfo,&SchemeProcedure::typeinfo,0);
      }
      if (local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98.tail_context._M_t.
        super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
        super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
        super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
             (__uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>)0x0;
      }
      else {
        local_98.tail_context._M_t.
        super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
        super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
        super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
             (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
             local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((tuple<TailContext_*,_std::default_delete<TailContext>_>)
            local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_Head_base<0UL,_TailContext_*,_false>)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(((shared_ptr<SchemeProcedure> *)
                       &(local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_SchemeObject)->
                      super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(((shared_ptr<SchemeProcedure> *)
                       &(local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_SchemeObject)->
                      super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
      }
      if (local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012e52d;
      local_b8._0_8_ = local_b8;
      local_b8._16_8_ = 0;
      p_Var15 = ((__x->
                 super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      local_b8._8_8_ = local_b8._0_8_;
      if (p_Var15 != (_List_node_base *)__x) {
        do {
          evaluate((ExecutionResult *)local_e8,(ASTNode *)p_Var15[1]._M_next,context);
          ExecutionResult::force_value((ExecutionResult *)&local_78);
          p_Var19 = (_List_node_base *)operator_new(0x20);
          p_Var8 = local_70;
          p_Var19[1]._M_next = local_78;
          p_Var19[1]._M_prev = (_List_node_base *)0x0;
          local_70 = (_List_node_base *)0x0;
          p_Var19[1]._M_prev = p_Var8;
          local_78 = (_List_node_base *)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var19);
          local_b8._16_8_ = local_b8._16_8_ + 1;
          if ((TailContext *)local_d0._0_8_ != (TailContext *)0x0) {
            std::default_delete<TailContext>::operator()(local_d0,(TailContext *)local_d0._0_8_);
          }
          local_d0._0_8_ = (TailContext *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_);
          }
          p_Var15 = p_Var15->_M_next;
        } while (p_Var15 != (_List_node_base *)__x);
      }
      ExecutionResult::ExecutionResult
                (__return_storage_ptr__,
                 (shared_ptr<SchemeProcedure> *)
                 &local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)local_b8);
      std::__cxx11::
      _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
      _M_clear((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)local_b8);
      if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)
          local_98.tail_context._M_t.
          super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
          super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
          super__Head_base<0UL,_TailContext_*,_false>._M_head_impl != (TailContext *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_98.tail_context._M_t.
                   super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
                   super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
                   super__Head_base<0UL,_TailContext_*,_false>._M_head_impl);
      }
    }
    else {
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
                ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &local_48,__x);
      SchemeSpecialForm::execute
                (__return_storage_ptr__,this_00,
                 (list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &local_48,context);
      std::__cxx11::_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
      ::_M_clear(&local_48);
    }
    if (this_04 != (TailContext *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04);
    }
  }
  if ((TailContext *)
      local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (TailContext *)0x0) {
LAB_0012e3eb:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult ASTNode::evaluate(const Context &context) const
{

    if(type == ast_type_t::INT)
        try
        {
            return ExecutionResult(std::make_shared<SchemeInt>(stoll(value)));
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid integer: " + value);
        }
    if(type == ast_type_t::FLOAT)
    {
        double float_val;
        try
        {
            auto slash_pos = value.find('/');
            if (slash_pos != std::string::npos)
            {
                auto num = value.substr(0, slash_pos);
                auto den = value.substr(slash_pos + 1);
                float_val = double(stoll(num)) / double(stoll(den));
            }
            else
            {
                float_val = stod(value);
            }
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid float: " + value);
        }
        return ExecutionResult(std::make_shared<SchemeFloat>(float_val));
    }
    if(type == ast_type_t::STRING)
        return ExecutionResult(std::make_shared<SchemeString>(value));
    if(type == ast_type_t::CHAR)
        return ExecutionResult(std::make_shared<SchemeChar>(char_name_to_char(value)));
    if(type == ast_type_t::BOOL)
        return ExecutionResult(value == "t" ? scheme_true : scheme_false);
    if(type == ast_type_t::NAME)
    {
        std::shared_ptr<SchemeObject> t{nullptr};
        bool res = context.get(value, t);
        if(t)
            return ExecutionResult(t);
        else if(res)
            throw eval_error("Unassigned variable: " + value);
        else
            throw eval_error("Undefined name: " + value);
    }
    if(type == ast_type_t::VECTOR)
        throw eval_error("Trying to evaluate a vector");
    if(list.empty())
        throw eval_error("Trying to evaluate empty list");

    auto func = list.front()->evaluate(context).force_value();
    auto sf = std::dynamic_pointer_cast<SchemeSpecialForm>(func);
    if(sf)
    {
        return sf->execute(list, context);
    }
    auto f = std::dynamic_pointer_cast<SchemeProcedure>(func);
    if(!f)
    {
        throw eval_error("Trying to call not a function");
    }
    std::list<std::shared_ptr<SchemeObject>> val_list;
    for(auto lit = std::next(list.begin()); lit != list.end(); ++lit)
    {
        val_list.push_back((*lit)->evaluate(context).force_value());
    }
    return ExecutionResult(f, val_list);
}